

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  char *buf_ptr;
  long lVar7;
  ulong uVar8;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  format_decimal_result<char_*> fVar9;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  scoped_padder p;
  ulong local_88 [2];
  buffer<char> local_78;
  memory_buf_t *local_58;
  scoped_padder local_50;
  
  scoped_padder::scoped_padder(&local_50,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar3 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar6 = strlen(pcVar3);
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar6);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ' ';
  pcVar3 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar6 = strlen(pcVar3);
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar3,pcVar3 + sVar6);
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar4 + 1;
  (dest->super_buffer<char>).ptr_[sVar4] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar5 = -uVar1;
  if (0 < (int)uVar1) {
    uVar5 = uVar1;
  }
  fVar9 = ::fmt::v9::detail::format_decimal<char,unsigned_int>((char *)&local_78,uVar5,0x15);
  local_78.capacity_ = (size_t)fVar9.begin;
  if ((int)uVar1 < 0) {
    *(char *)(local_78.capacity_ + -1) = '-';
    local_78.capacity_ = local_78.capacity_ + -1;
  }
  lVar7 = (long)&local_78 - local_78.capacity_;
  if (-0x16 < lVar7) {
    ::fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,(char *)local_78.capacity_,
               (char *)(local_78.capacity_ + lVar7 + 0x15));
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = ' ';
    uVar1 = tm_time->tm_hour;
    uVar8 = (ulong)uVar1;
    if (uVar8 < 100) {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar4 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar4 + 1;
      (dest->super_buffer<char>).ptr_[sVar4] = (byte)(uVar8 / 10) | 0x30;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar4 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar4 + 1;
      (dest->super_buffer<char>).ptr_[sVar4] =
           (char)uVar1 + ((char)(uVar1 / 10) + (char)(uVar1 / 10)) * -5 | 0x30;
    }
    else {
      local_78.size_ = (dest->super_buffer<char>).size_;
      local_78._vptr_buffer = (_func_int **)&PTR_grow_0014e310;
      fmt.size_ = 5;
      fmt.data_ = "{:02}";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
      args.desc_ = 1;
      local_88[0] = uVar8;
      local_78.capacity_ = local_78.size_;
      local_58 = dest;
      ::fmt::v9::detail::vformat_to<char>(&local_78,fmt,args,(locale_ref)0x0);
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = ':';
    uVar1 = tm_time->tm_min;
    uVar8 = (ulong)uVar1;
    if (uVar8 < 100) {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar4 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar4 + 1;
      (dest->super_buffer<char>).ptr_[sVar4] = (byte)(uVar8 / 10) | 0x30;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar4 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar4 + 1;
      (dest->super_buffer<char>).ptr_[sVar4] =
           (char)uVar1 + ((char)(uVar1 / 10) + (char)(uVar1 / 10)) * -5 | 0x30;
    }
    else {
      local_78.size_ = (dest->super_buffer<char>).size_;
      local_78._vptr_buffer = (_func_int **)&PTR_grow_0014e310;
      fmt_00.size_ = 5;
      fmt_00.data_ = "{:02}";
      args_00.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
      args_00.desc_ = 1;
      local_88[0] = uVar8;
      local_78.capacity_ = local_78.size_;
      local_58 = dest;
      ::fmt::v9::detail::vformat_to<char>(&local_78,fmt_00,args_00,(locale_ref)0x0);
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = ':';
    uVar1 = tm_time->tm_sec;
    uVar8 = (ulong)uVar1;
    if (uVar8 < 100) {
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar4 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar4 + 1;
      (dest->super_buffer<char>).ptr_[sVar4] = (byte)(uVar8 / 10) | 0x30;
      if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      }
      sVar4 = (dest->super_buffer<char>).size_;
      (dest->super_buffer<char>).size_ = sVar4 + 1;
      (dest->super_buffer<char>).ptr_[sVar4] =
           (char)uVar1 + ((char)(uVar1 / 10) + (char)(uVar1 / 10)) * -5 | 0x30;
    }
    else {
      local_78.size_ = (dest->super_buffer<char>).size_;
      local_78._vptr_buffer = (_func_int **)&PTR_grow_0014e310;
      fmt_01.size_ = 5;
      fmt_01.data_ = "{:02}";
      args_01.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
      args_01.desc_ = 1;
      local_88[0] = uVar8;
      local_78.capacity_ = local_78.size_;
      local_58 = dest;
      ::fmt::v9::detail::vformat_to<char>(&local_78,fmt_01,args_01,(locale_ref)0x0);
    }
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar4 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar4 + 1;
    (dest->super_buffer<char>).ptr_[sVar4] = ' ';
    iVar2 = tm_time->tm_year;
    uVar1 = iVar2 + 0x76c;
    uVar5 = -uVar1;
    if (0 < (int)uVar1) {
      uVar5 = uVar1;
    }
    fVar9 = ::fmt::v9::detail::format_decimal<char,unsigned_int>((char *)&local_78,uVar5,0x15);
    local_78.capacity_ = (size_t)fVar9.begin;
    if (iVar2 < -0x76c) {
      *(char *)(local_78.capacity_ + -1) = '-';
      local_78.capacity_ = local_78.capacity_ + -1;
    }
    lVar7 = (long)&local_78 - local_78.capacity_;
    if (-0x16 < lVar7) {
      ::fmt::v9::detail::buffer<char>::append<char>
                (&dest->super_buffer<char>,(char *)local_78.capacity_,
                 (char *)(local_78.capacity_ + lVar7 + 0x15));
      scoped_padder::~scoped_padder(&local_50);
      return;
    }
  }
  ::fmt::v9::detail::assert_fail
            ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
             ,0x199,"negative value");
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }